

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O0

void __thiscall trackerboy::apu::NoiseChannel::setNoise(NoiseChannel *this,uint8_t noisereg)

{
  ushort uVar1;
  uint uVar2;
  Timer *this_00;
  byte local_12;
  int scf;
  uint8_t drf;
  uint8_t noisereg_local;
  NoiseChannel *this_local;
  
  (this->super_Channel).mFrequency = (ushort)noisereg;
  uVar1 = (this->super_Channel).mFrequency;
  if ((uVar1 & 7) == 0) {
    local_12 = 8;
  }
  else {
    local_12 = ((byte)uVar1 & 7) << 4;
  }
  this->mHalfWidth = ((int)(uint)(this->super_Channel).mFrequency >> 3 & 1U) != 0;
  uVar2 = (int)(uint)(this->super_Channel).mFrequency >> 4;
  this->mValidScf = uVar2 < 0xe;
  this_00 = Channel::timer(&this->super_Channel);
  Timer::setPeriod(this_00,(uint)local_12 << ((byte)uVar2 & 0x1f));
  return;
}

Assistant:

void NoiseChannel::setNoise(uint8_t noisereg) noexcept {
    mFrequency = noisereg;
    // drf = "dividing ratio frequency", divisor, etc
    uint8_t drf = mFrequency & 0x7;
    if (drf == 0) {
        drf = 8;
    } else {
        drf *= 16;
    }
    mHalfWidth = !!((mFrequency >> 3) & 1);
    // scf = "shift clock frequency"
    auto scf = mFrequency >> 4;
    mValidScf = scf < 0xE; // obscure behavior: a scf of 14 or 15 results in the channel receiving no clocks
    timer().setPeriod(drf << scf);
}